

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_NameEntry_Test::TestBody(X509Test_NameEntry_Test *this)

{
  int iVar1;
  X509_NAME_ENTRY *pXVar2;
  char *in_R9;
  char *pcVar3;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  anon_class_8_1_898f2789 check_name;
  UniquePtr<X509_NAME> name;
  AssertHelper local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_class_8_1_898f2789 local_40;
  _Head_base<0UL,_X509_name_st_*,_false> local_38;
  string local_30;
  
  local_38._M_head_impl = (X509_name_st *)X509_NAME_new();
  local_50[0] = (internal)(local_38._M_head_impl != (X509_name_st *)0x0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38._M_head_impl == (X509_name_st *)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_50,(AssertionResult *)0x546ced,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1633,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    local_60.data_ = (AssertHelperData *)local_40.name;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      local_60.data_ = (AssertHelperData *)local_40.name;
    }
  }
  else {
    local_40.name = (UniquePtr<X509_NAME> *)&local_38;
    TestBody::anon_class_8_1_898f2789::operator()(&local_40,"");
    pcVar3 = &DAT_ffffffff;
    iVar1 = X509_NAME_add_entry_by_NID((X509_NAME *)local_38._M_head_impl,0x11,0x1000,"Org",-1,-1,0)
    ;
    local_50[0] = (internal)(iVar1 != 0);
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,local_50,
                 (AssertionResult *)
                 "X509_NAME_add_entry_by_NID( name.get(), 17, (0x1000), reinterpret_cast<const unsigned char *>(\"Org\"), -1, -1, 0)"
                 ,"false","true",pcVar3);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1656,local_30._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    }
    else {
      TestBody::anon_class_8_1_898f2789::operator()(&local_40,"O=Org");
      pcVar3 = &DAT_ffffffff;
      iVar1 = X509_NAME_add_entry_by_NID
                        ((X509_NAME *)local_38._M_head_impl,0xd,0x1000,"Name",-1,-1,0);
      local_50[0] = (internal)(iVar1 != 0);
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,local_50,
                   (AssertionResult *)
                   "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name\"), -1, -1, 0)"
                   ,"false","true",pcVar3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x165d,local_30._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      }
      else {
        TestBody::anon_class_8_1_898f2789::operator()(&local_40,"CN=Name,O=Org");
        pcVar3 = (char *)0x1;
        iVar1 = X509_NAME_add_entry_by_NID
                          ((X509_NAME *)local_38._M_head_impl,0x12,0x1000,(uchar *)"Unit",-1,1,0);
        local_50[0] = (internal)(iVar1 != 0);
        local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,local_50,
                     (AssertionResult *)
                     "X509_NAME_add_entry_by_NID( name.get(), 18, (0x1000), reinterpret_cast<const unsigned char *>(\"Unit\"), -1, 1, 0)"
                     ,"false","true",pcVar3);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1665,local_30._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        }
        else {
          TestBody::anon_class_8_1_898f2789::operator()(&local_40,"CN=Name,OU=Unit,O=Org");
          pcVar3 = (char *)0x2;
          iVar1 = X509_NAME_add_entry_by_NID
                            ((X509_NAME *)local_38._M_head_impl,0x11,0x1000,(uchar *)"Org2",-1,2,-1)
          ;
          local_50[0] = (internal)(iVar1 != 0);
          local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_60);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_30,local_50,
                       (AssertionResult *)
                       "X509_NAME_add_entry_by_NID( name.get(), 17, (0x1000), reinterpret_cast<const unsigned char *>(\"Org2\"), -1, 2, -1)"
                       ,"false","true",pcVar3);
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x166e,local_30._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          }
          else {
            TestBody::anon_class_8_1_898f2789::operator()(&local_40,"CN=Name,O=Org2+OU=Unit,O=Org");
            pcVar3 = (char *)0x2;
            iVar1 = X509_NAME_add_entry_by_NID
                              ((X509_NAME *)local_38._M_head_impl,0xd,0x1000,(uchar *)"Name2",-1,2,
                               -1);
            local_50[0] = (internal)(iVar1 != 0);
            local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_60);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_30,local_50,
                         (AssertionResult *)
                         "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name2\"), -1, 2, -1)"
                         ,"false","true",pcVar3);
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x1675,local_30._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
            }
            else {
              TestBody::anon_class_8_1_898f2789::operator()
                        (&local_40,"CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org");
              pcVar3 = (char *)0x0;
              iVar1 = X509_NAME_add_entry_by_NID
                                ((X509_NAME *)local_38._M_head_impl,0xe,0x1000,"US",-1,0,-1);
              local_50[0] = (internal)(iVar1 != 0);
              local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_60);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_30,local_50,
                           (AssertionResult *)
                           "X509_NAME_add_entry_by_NID( name.get(), 14, (0x1000), reinterpret_cast<const unsigned char *>(\"US\"), -1, 0, -1)"
                           ,"false","true",pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_58,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x167c,local_30._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
              }
              else {
                TestBody::anon_class_8_1_898f2789::operator()
                          (&local_40,"CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");
                pcVar3 = &DAT_ffffffff;
                iVar1 = X509_NAME_add_entry_by_NID
                                  ((X509_NAME *)local_38._M_head_impl,0xd,0x1000,(uchar *)"Name3",-1
                                   ,-1,1);
                local_50[0] = (internal)(iVar1 != 0);
                local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_60);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_30,local_50,
                             (AssertionResult *)
                             "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name3\"), -1, -1, 1)"
                             ,"false","true",pcVar3);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1683,local_30._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
                }
                else {
                  TestBody::anon_class_8_1_898f2789::operator()
                            (&local_40,"CN=Name3,CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");
                  pcVar3 = (char *)0x3;
                  iVar1 = X509_NAME_add_entry_by_NID
                                    ((X509_NAME *)local_38._M_head_impl,0xd,0x1000,(uchar *)"Name4",
                                     -1,3,0);
                  local_50[0] = (internal)(iVar1 != 0);
                  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if ((bool)local_50[0]) {
                    TestBody::anon_class_8_1_898f2789::operator()
                              (&local_40,
                               "CN=Name3,CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");
                    pXVar2 = X509_NAME_delete_entry((X509_NAME *)local_38._M_head_impl,7);
                    X509_NAME_ENTRY_free(pXVar2);
                    TestBody::anon_class_8_1_898f2789::operator()
                              (&local_40,"CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");
                    pXVar2 = X509_NAME_delete_entry((X509_NAME *)local_38._M_head_impl,0);
                    X509_NAME_ENTRY_free(pXVar2);
                    TestBody::anon_class_8_1_898f2789::operator()
                              (&local_40,"CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org");
                    pXVar2 = X509_NAME_delete_entry((X509_NAME *)local_38._M_head_impl,1);
                    X509_NAME_ENTRY_free(pXVar2);
                    TestBody::anon_class_8_1_898f2789::operator()
                              (&local_40,"CN=Name,O=Org2+CN=Name2,CN=Name4,O=Org");
                    pXVar2 = X509_NAME_delete_entry((X509_NAME *)local_38._M_head_impl,1);
                    X509_NAME_ENTRY_free(pXVar2);
                    TestBody::anon_class_8_1_898f2789::operator()
                              (&local_40,"CN=Name,O=Org2+CN=Name2,O=Org");
                    pXVar2 = X509_NAME_delete_entry((X509_NAME *)local_38._M_head_impl,2);
                    X509_NAME_ENTRY_free(pXVar2);
                    TestBody::anon_class_8_1_898f2789::operator()
                              (&local_40,"CN=Name,CN=Name2,O=Org");
                    pXVar2 = X509_NAME_delete_entry((X509_NAME *)local_38._M_head_impl,1);
                    X509_NAME_ENTRY_free(pXVar2);
                    TestBody::anon_class_8_1_898f2789::operator()(&local_40,"CN=Name,O=Org");
                    goto LAB_003f2e4e;
                  }
                  testing::Message::Message((Message *)&local_60);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_30,local_50,
                             (AssertionResult *)
                             "X509_NAME_add_entry_by_NID( name.get(), 13, (0x1000), reinterpret_cast<const unsigned char *>(\"Name4\"), -1, 3, 0)"
                             ,"false","true",pcVar3);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x168c,local_30._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
                }
              }
            }
          }
        }
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_60.data_ != (AssertHelperData *)0x0) {
    (**(code **)&(*(X509_name_st **)local_60.data_)->modified)();
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
LAB_003f2e4e:
  std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST(X509Test, NameEntry) {
  bssl::UniquePtr<X509_NAME> name(X509_NAME_new());
  ASSERT_TRUE(name);

  auto check_name = [&](const char *expected_rfc2253) {
    // Check RDN indices are self-consistent.
    int num = X509_NAME_entry_count(name.get());
    if (num > 0) {
      // RDN indices must start at zero.
      EXPECT_EQ(0, X509_NAME_ENTRY_set(X509_NAME_get_entry(name.get(), 0)));
    }
    for (int i = 1; i < num; i++) {
      int prev = X509_NAME_ENTRY_set(X509_NAME_get_entry(name.get(), i - 1));
      int current = X509_NAME_ENTRY_set(X509_NAME_get_entry(name.get(), i));
      // RDN indices must increase consecutively.
      EXPECT_TRUE(prev == current || prev + 1 == current)
          << "Entry " << i << " has RDN index " << current
          << " which is inconsistent with previous index " << prev;
    }

    // Check the name based on the RFC 2253 serialization. Note the RFC 2253
    // serialization is in reverse.
    bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    EXPECT_GE(X509_NAME_print_ex(bio.get(), name.get(), 0, XN_FLAG_RFC2253), 0);
    const uint8_t *data;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &data, &len));
    EXPECT_EQ(expected_rfc2253, std::string(data, data + len));
  };

  check_name("");

  // |loc| = -1, |set| = 0 appends as new RDNs.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_organizationName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Org"), /*len=*/-1, /*loc=*/-1,
      /*set=*/0));
  check_name("O=Org");

  // |loc| = -1, |set| = 0 appends as new RDNs.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name"), /*len=*/-1, /*loc=*/-1,
      /*set=*/0));
  check_name("CN=Name,O=Org");

  // Inserting in the middle of the set, but with |set| = 0 inserts a new RDN
  // and fixes the "set" values as needed.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_organizationalUnitName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Unit"), /*len=*/-1, /*loc=*/1,
      /*set=*/0));
  check_name("CN=Name,OU=Unit,O=Org");

  // |set = -1| adds to the previous entry's RDN. (Although putting O and OU at
  // the same level makes little sense, the test is written this way to check
  // the function isn't using attribute types to order things.)
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_organizationName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Org2"), /*len=*/-1, /*loc=*/2,
      /*set=*/-1));
  check_name("CN=Name,O=Org2+OU=Unit,O=Org");

  // |set| = 1 adds to the next entry's RDN.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name2"), /*len=*/-1, /*loc=*/2,
      /*set=*/-1));
  check_name("CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org");

  // If there is no previous RDN, |set| = -1 makes a new RDN.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_countryName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("US"), /*len=*/-1, /*loc=*/0,
      /*set=*/-1));
  check_name("CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");

  // Likewise if there is no next RDN.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name3"), /*len=*/-1, /*loc=*/-1,
      /*set=*/1));
  check_name("CN=Name3,CN=Name,O=Org2+CN=Name2+OU=Unit,O=Org,C=US");

  // If |set| = 0 and we insert in the middle of an existing RDN, it adds an
  // RDN boundary after the entry but not before. This is a quirk of how the
  // function is implemented and hopefully not something any caller depends on.
  ASSERT_TRUE(X509_NAME_add_entry_by_NID(
      name.get(), NID_commonName, MBSTRING_UTF8,
      reinterpret_cast<const unsigned char *>("Name4"), /*len=*/-1, /*loc=*/3,
      /*set=*/0));
  check_name("CN=Name3,CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");

  // Entries may be deleted.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 7));
  check_name("CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org,C=US");

  // When deleting the only attribute in an RDN, index invariants should still
  // hold.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 0));
  check_name("CN=Name,O=Org2+CN=Name2,CN=Name4+OU=Unit,O=Org");

  // Index invariants also hold when deleting attributes from non-singular RDNs.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 1));
  check_name("CN=Name,O=Org2+CN=Name2,CN=Name4,O=Org");
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 1));
  check_name("CN=Name,O=Org2+CN=Name2,O=Org");

  // Same as above, but delete the second attribute first.
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 2));
  check_name("CN=Name,CN=Name2,O=Org");
  X509_NAME_ENTRY_free(X509_NAME_delete_entry(name.get(), 1));
  check_name("CN=Name,O=Org");
}